

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O0

Hop_Obj_t *
Abc_NodeIfNodeResyn(Bdc_Man_t *p,Hop_Man_t *pHop,Hop_Obj_t *pRoot,int nVars,Vec_Int_t *vTruth,
                   uint *puCare,float dProb)

{
  float fVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  uint *pOut;
  Bdc_Fun_t *pBVar4;
  Bdc_Fun_t *pBVar5;
  Hop_Obj_t *p1;
  int local_58;
  float Prob;
  int i;
  int nNodes;
  Bdc_Fun_t *pFunc;
  uint *pTruth;
  float dProb_local;
  uint *puCare_local;
  Vec_Int_t *vTruth_local;
  int nVars_local;
  Hop_Obj_t *pRoot_local;
  Hop_Man_t *pHop_local;
  Bdc_Man_t *p_local;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBidec.c"
                  ,0x36,
                  "Hop_Obj_t *Abc_NodeIfNodeResyn(Bdc_Man_t *, Hop_Man_t *, Hop_Obj_t *, int, Vec_Int_t *, unsigned int *, float)"
                 );
  }
  pHVar3 = Hop_Regular(pRoot);
  pOut = Hop_ManConvertAigToTruth(pHop,pHVar3,nVars,vTruth,0);
  iVar2 = Hop_IsComplement(pRoot);
  if (iVar2 != 0) {
    Extra_TruthNot(pOut,pOut,nVars);
  }
  if (dProb < 0.0) {
    Bdc_ManDecompose(p,pOut,puCare,nVars,(Vec_Ptr_t *)0x0,1000);
  }
  else {
    fVar1 = dProb * 2.0 * (1.0 - dProb);
    if ((fVar1 < 0.0) || (0.5 < fVar1)) {
      __assert_fail("Prob >= 0.0 && Prob <= 0.5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBidec.c"
                    ,0x3f,
                    "Hop_Obj_t *Abc_NodeIfNodeResyn(Bdc_Man_t *, Hop_Man_t *, Hop_Obj_t *, int, Vec_Int_t *, unsigned int *, float)"
                   );
    }
    if (fVar1 < 0.4) {
      Bdc_ManDecompose(p,pOut,puCare,nVars,(Vec_Ptr_t *)0x0,1000);
    }
    else {
      Extra_TruthNot(puCare,puCare,nVars);
      if (dProb <= 0.5) {
        Extra_TruthSharp(pOut,pOut,puCare,nVars);
      }
      else {
        Extra_TruthOr(pOut,pOut,puCare,nVars);
      }
      Extra_TruthNot(puCare,puCare,nVars);
      Bdc_ManDecompose(p,pOut,(uint *)0x0,nVars,(Vec_Ptr_t *)0x0,1000);
    }
  }
  pBVar4 = Bdc_ManFunc(p,0);
  pHVar3 = Hop_ManConst1(pHop);
  Bdc_FuncSetCopy(pBVar4,pHVar3);
  for (local_58 = 0; local_58 < nVars; local_58 = local_58 + 1) {
    pBVar4 = Bdc_ManFunc(p,local_58 + 1);
    pHVar3 = Hop_ManPi(pHop,local_58);
    Bdc_FuncSetCopy(pBVar4,pHVar3);
  }
  iVar2 = Bdc_ManNodeNum(p);
  for (local_58 = nVars + 1; local_58 < iVar2; local_58 = local_58 + 1) {
    pBVar4 = Bdc_ManFunc(p,local_58);
    pBVar5 = Bdc_FuncFanin0(pBVar4);
    pHVar3 = Bdc_FunCopyHop(pBVar5);
    pBVar5 = Bdc_FuncFanin1(pBVar4);
    p1 = Bdc_FunCopyHop(pBVar5);
    pHVar3 = Hop_And(pHop,pHVar3,p1);
    Bdc_FuncSetCopy(pBVar4,pHVar3);
  }
  pBVar4 = Bdc_ManRoot(p);
  pHVar3 = Bdc_FunCopyHop(pBVar4);
  return pHVar3;
}

Assistant:

Hop_Obj_t * Abc_NodeIfNodeResyn( Bdc_Man_t * p, Hop_Man_t * pHop, Hop_Obj_t * pRoot, int nVars, Vec_Int_t * vTruth, unsigned * puCare, float dProb )
{
    unsigned * pTruth;
    Bdc_Fun_t * pFunc;
    int nNodes, i;
    assert( nVars <= 16 );
    // derive truth table
    pTruth = Hop_ManConvertAigToTruth( pHop, Hop_Regular(pRoot), nVars, vTruth, 0 );
    if ( Hop_IsComplement(pRoot) )
        Extra_TruthNot( pTruth, pTruth, nVars );
    // perform power-aware decomposition
    if ( dProb >= 0.0 )
    {
        float Prob = (float)2.0 * dProb * (1.0 - dProb);
        assert( Prob >= 0.0 && Prob <= 0.5 );
        if ( Prob >= 0.4 )
        {
            Extra_TruthNot( puCare, puCare, nVars );
            if ( dProb > 0.5 ) // more 1s than 0s
                Extra_TruthOr( pTruth, pTruth, puCare, nVars );
            else
                Extra_TruthSharp( pTruth, pTruth, puCare, nVars );
            Extra_TruthNot( puCare, puCare, nVars );
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, NULL, nVars, NULL, 1000 );
        }
        else
        {
            // decompose truth table
            Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
        }
    }
    else
    {
        // decompose truth table
        Bdc_ManDecompose( p, pTruth, puCare, nVars, NULL, 1000 );
    }
    // convert back into HOP
    Bdc_FuncSetCopy( Bdc_ManFunc( p, 0 ), Hop_ManConst1( pHop ) );
    for ( i = 0; i < nVars; i++ )
        Bdc_FuncSetCopy( Bdc_ManFunc( p, i+1 ), Hop_ManPi( pHop, i ) );
    nNodes = Bdc_ManNodeNum(p);
    for ( i = nVars + 1; i < nNodes; i++ )
    {
        pFunc = Bdc_ManFunc( p, i );
        Bdc_FuncSetCopy( pFunc, Hop_And( pHop, Bdc_FunCopyHop(Bdc_FuncFanin0(pFunc)), Bdc_FunCopyHop(Bdc_FuncFanin1(pFunc)) ) );
    }
    return Bdc_FunCopyHop( Bdc_ManRoot(p) );
}